

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O2

HighsDebugStatus __thiscall HEkk::debugComputeDual(HEkk *this,bool initialise)

{
  uint uVar1;
  HighsOptions *pHVar2;
  pointer pcVar3;
  pointer pdVar4;
  ulong uVar5;
  ulong uVar6;
  HighsInt iVar;
  ulong uVar7;
  int iVar8;
  size_type __n;
  double dVar9;
  double dVar10;
  double dVar11;
  vector<double,_std::allocator<double>_> delta_dual;
  vector<double,_std::allocator<double>_> new_dual;
  allocator local_a9;
  double local_a8;
  double local_a0;
  double local_98;
  value_type_conflict1 local_90;
  _Vector_base<double,_std::allocator<double>_> local_88;
  _Vector_base<double,_std::allocator<double>_> local_70;
  string local_58;
  string local_38;
  
  if (debugComputeDual(bool)::previous_dual == '\0') {
    iVar8 = __cxa_guard_acquire();
    if (iVar8 != 0) {
      debugComputeDual::previous_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      debugComputeDual::previous_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      debugComputeDual::previous_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,
                   &debugComputeDual::previous_dual,&__dso_handle);
      __cxa_guard_release();
    }
  }
  if (initialise) {
    std::vector<double,_std::allocator<double>_>::operator=
              (&debugComputeDual::previous_dual,&(this->info_).workDual_);
  }
  else {
    pHVar2 = this->options_;
    uVar1 = (this->lp_).num_row_;
    uVar6 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar6;
    }
    local_a8 = 0.0;
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      iVar8 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      dVar9 = ABS((this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[iVar8] +
                  (this->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[iVar8]);
      if (local_a8 <= dVar9) {
        local_a8 = dVar9;
      }
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_70,&(this->info_).workDual_);
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __n = (long)(this->lp_).num_row_ + (long)(this->lp_).num_col_;
    local_90 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)&local_88,__n,&local_90);
    pdVar4 = debugComputeDual::previous_dual.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (this->basis_).nonbasicFlag_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar5 = 0;
    if (0 < (HighsInt)__n) {
      uVar5 = __n & 0xffffffff;
    }
    dVar9 = 0.0;
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      if ((pcVar3[uVar6] != '\0') &&
         (dVar10 = ABS((this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar6] +
                       (this->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar6]), dVar9 <= dVar10)) {
        dVar9 = dVar10;
      }
    }
    dVar11 = (local_a8 + dVar9) * 0.5 * 1e-16;
    dVar10 = 1e-16;
    if (1e-16 <= dVar11) {
      dVar10 = dVar11;
    }
    uVar6 = 0;
    iVar8 = 0;
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      if (pcVar3[uVar7] == '\0') {
        pdVar4[uVar7] = 0.0;
        local_70._M_impl.super__Vector_impl_data._M_start[uVar7] = 0.0;
      }
      else if (dVar10 <= ABS(local_70._M_impl.super__Vector_impl_data._M_start[uVar7] -
                             pdVar4[uVar7])) {
        local_88._M_impl.super__Vector_impl_data._M_start[uVar7] =
             local_70._M_impl.super__Vector_impl_data._M_start[uVar7] - pdVar4[uVar7];
        dVar11 = (pHVar2->super_HighsOptionsStruct).dual_feasibility_tolerance;
        if ((dVar11 < ABS(pdVar4[uVar7])) &&
           (dVar11 < ABS(local_70._M_impl.super__Vector_impl_data._M_start[uVar7]))) {
          uVar6 = (ulong)((int)uVar6 +
                         (uint)(pdVar4[uVar7] *
                                local_70._M_impl.super__Vector_impl_data._M_start[uVar7] < 0.0));
        }
        iVar8 = iVar8 + 1;
      }
    }
    if (iVar8 != 0) {
      local_a0 = dVar9;
      local_98 = dVar10;
      printf("\nHEkk::debugComputeDual Iteration %d: Number of dual sign changes = %d\n",
             (ulong)(uint)this->iteration_count_,uVar6);
      printf("   |cB| = %g; |cN| = %g; zero delta dual = %g\n",local_a8,local_a0,local_98);
      std::__cxx11::string::string((string *)&local_38,"Delta duals",(allocator *)&local_90);
      std::__cxx11::string::string((string *)&local_58,"Unknown",&local_a9);
      analyseVectorValues(&(pHVar2->super_HighsOptionsStruct).log_options,&local_38,(HighsInt)__n,
                          (vector<double,_std::allocator<double>_> *)&local_88,false,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_38);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_70);
  }
  return kOk;
}

Assistant:

HighsDebugStatus HEkk::debugComputeDual(const bool initialise) const {
  static vector<double> previous_dual;
  const HighsSimplexInfo& info = this->info_;
  if (initialise) {
    previous_dual = info.workDual_;
    return HighsDebugStatus::kOk;
  }
  const HighsOptions& options = *(this->options_);
  //  if (options.highs_debug_level < kHighsDebugLevelCheap) return
  //  HighsDebugStatus::kNotChecked;
  const HighsLp& lp = this->lp_;
  const SimplexBasis& basis = this->basis_;

  double norm_basic_costs = 0;
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    const double value = info.workCost_[basis.basicIndex_[iRow]] +
                         info.workShift_[basis.basicIndex_[iRow]];
    norm_basic_costs = max(fabs(value), norm_basic_costs);
  }

  vector<double> new_dual = info.workDual_;
  vector<double> delta_dual;
  HighsInt num_tot = lp.num_col_ + lp.num_row_;
  delta_dual.assign(num_tot, 0);
  HighsInt num_dual_sign_change = 0;
  HighsInt num_delta_dual_values = 0;
  double norm_nonbasic_costs = 0;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (!basis.nonbasicFlag_[iVar]) continue;
    double value = info.workCost_[iVar] + info.workShift_[iVar];
    norm_nonbasic_costs = max(fabs(value), norm_nonbasic_costs);
  }

  const double zero_delta_dual =
      max(0.5 * (norm_basic_costs + norm_nonbasic_costs) * 1e-16, 1e-16);
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (!basis.nonbasicFlag_[iVar]) {
      previous_dual[iVar] = 0;
      new_dual[iVar] = 0;
      continue;
    }
    double delta = new_dual[iVar] - previous_dual[iVar];
    if (fabs(delta) < zero_delta_dual) continue;
    delta_dual[iVar] = delta;
    const bool sign_change =
        fabs(previous_dual[iVar]) > options.dual_feasibility_tolerance &&
        fabs(new_dual[iVar]) > options.dual_feasibility_tolerance &&
        previous_dual[iVar] * new_dual[iVar] < 0;
    if (sign_change) num_dual_sign_change++;
    num_delta_dual_values++;
  }
  if (num_delta_dual_values) {
    printf(
        "\nHEkk::debugComputeDual Iteration %d: Number of dual sign changes = "
        "%d\n",
        (int)iteration_count_, (int)num_dual_sign_change);
    printf("   |cB| = %g; |cN| = %g; zero delta dual = %g\n", norm_basic_costs,
           norm_nonbasic_costs, zero_delta_dual);
    //    analyseVectorValues(&options.log_options, "Previous duals", num_tot,
    //    previous_dual); analyseVectorValues(&options.log_options, "New duals",
    //    num_tot, new_dual);
    analyseVectorValues(&options.log_options, "Delta duals", num_tot,
                        delta_dual);
  }
  return HighsDebugStatus::kOk;
}